

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int get_parts(void)

{
  CURLUcode CVar1;
  int iVar2;
  CURLU *u;
  CURLU *urlp;
  int local_10;
  CURLUcode rc;
  int error;
  int i;
  
  local_10 = 0;
  rc = CURLUE_OK;
  while( true ) {
    if (get_parts_list[(int)rc].in == (char *)0x0 || local_10 != 0) {
      return local_10;
    }
    u = (CURLU *)curl_url();
    if (u == (CURLU *)0x0) break;
    CVar1 = curl_url_set(u,0,get_parts_list[(int)rc].in,get_parts_list[(int)rc].urlflags);
    if (CVar1 == get_parts_list[(int)rc].ucode) {
      if ((get_parts_list[(int)rc].ucode == CURLUE_OK) &&
         (iVar2 = checkparts(u,get_parts_list[(int)rc].in,get_parts_list[(int)rc].out,
                             get_parts_list[(int)rc].getflags), iVar2 != 0)) {
        local_10 = local_10 + 1;
      }
    }
    else {
      curl_mfprintf(_stderr,"Get parts\nin: %s\nreturned %d (expected %d)\n",
                    get_parts_list[(int)rc].in,CVar1,get_parts_list[(int)rc].ucode);
      local_10 = local_10 + 1;
    }
    curl_url_cleanup(u);
    rc = rc + CURLUE_BAD_HANDLE;
  }
  return local_10 + 1;
}

Assistant:

static int get_parts(void)
{
  int i;
  int error = 0;
  for(i = 0; get_parts_list[i].in && !error; i++) {
    CURLUcode rc;
    CURLU *urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    rc = curl_url_set(urlp, CURLUPART_URL,
                      get_parts_list[i].in,
                      get_parts_list[i].urlflags);
    if(rc != get_parts_list[i].ucode) {
      fprintf(stderr, "Get parts\nin: %s\nreturned %d (expected %d)\n",
              get_parts_list[i].in, (int)rc, get_parts_list[i].ucode);
      error++;
    }
    else if(get_parts_list[i].ucode) {
      /* the expected error happened */
    }
    else if(checkparts(urlp, get_parts_list[i].in, get_parts_list[i].out,
                       get_parts_list[i].getflags))
      error++;
    curl_url_cleanup(urlp);
  }
  return error;
}